

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

ostream * pstack::Procman::operator<<(ostream *os,UnwindMechanism mech)

{
  UnwindMechanism mech_local;
  ostream *os_local;
  
  switch(mech) {
  case MACHINEREGS:
    os_local = std::operator<<(os,"machine registers");
    break;
  case DWARF:
    os_local = std::operator<<(os,"DWARF");
    break;
  case FRAMEPOINTER:
    os_local = std::operator<<(os,"frame pointer");
    break;
  case BAD_IP_RECOVERY:
    os_local = std::operator<<(os,"popped faulting IP");
    break;
  case TRAMPOLINE:
    os_local = std::operator<<(os,"signal trampoline");
    break;
  case LOGFILE:
    os_local = std::operator<<(os,"log file");
    break;
  case INVALID:
    os_local = std::operator<<(os,"invalid");
    break;
  default:
    abort();
  }
  return os_local;
}

Assistant:

std::ostream &operator << (std::ostream &os, UnwindMechanism mech) {
   switch (mech) {
      case UnwindMechanism::MACHINEREGS: return os << "machine registers";
      case UnwindMechanism::DWARF: return os << "DWARF";
      case UnwindMechanism::FRAMEPOINTER: return os << "frame pointer";
      case UnwindMechanism::BAD_IP_RECOVERY: return os << "popped faulting IP";
      case UnwindMechanism::TRAMPOLINE: return os << "signal trampoline";
      case UnwindMechanism::LOGFILE: return os << "log file";
      case UnwindMechanism::INVALID: return os << "invalid";
   }
   abort();
}